

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int Cudd_DumpBlifBody(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp,int mv)

{
  int iVar1;
  int iVar2;
  st__table *visited;
  ulong uVar3;
  char *pcVar4;
  char *__format;
  ulong uVar5;
  
  visited = st__init_table(st__ptrcmp,st__ptrhash);
  if (visited == (st__table *)0x0) {
    return 0;
  }
  uVar3 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar3;
  }
  do {
    if (uVar5 == uVar3) {
      pcVar4 = ".def 0\n";
      if (mv == 0) {
        pcVar4 = "";
      }
      uVar3 = 0;
      iVar1 = 0;
      goto LAB_00652ff9;
    }
    iVar1 = ddDoDumpBlif(dd,(DdNode *)((ulong)f[uVar3] & 0xfffffffffffffffe),fp,visited,inames,mv);
    uVar3 = uVar3 + 1;
  } while (iVar1 != 0);
LAB_00652fcd:
  iVar1 = 0;
  goto LAB_0065307b;
  while( true ) {
    if (onames == (char **)0x0) {
      iVar2 = fprintf((FILE *)fp,".names %lx f%d\n",(ulong)f[uVar3] / 0x28,uVar3 & 0xffffffff);
    }
    else {
      iVar2 = fprintf((FILE *)fp,".names %lx %s\n",(ulong)f[uVar3] / 0x28,onames[uVar3]);
    }
    if (iVar2 == -1) goto LAB_00652fcd;
    __format = "%s0 1\n";
    if (((ulong)f[uVar3] & 1) == 0) {
      __format = "%s1 1\n";
    }
    iVar2 = fprintf((FILE *)fp,__format,pcVar4);
    uVar3 = uVar3 + 1;
    if (iVar2 == -1) break;
LAB_00652ff9:
    if (uVar5 == uVar3) {
      iVar1 = 1;
      break;
    }
  }
LAB_0065307b:
  st__free_table(visited);
  return iVar1;
}

Assistant:

int
Cudd_DumpBlifBody(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */,
  int mv /* 0: blif, 1: blif-MV */)
{
    st__table    *visited = NULL;
    int         retval;
    int         i;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        retval = ddDoDumpBlif(dd,Cudd_Regular(f[i]),fp,visited,inames,mv);
        if (retval == 0) goto failure;
    }

    /* To account for the possible complement on the root,
    ** we put either a buffer or an inverter at the output of
    ** the multiplexer representing the top node.
    */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,
#if SIZEOF_VOID_P == 8
                ".names %lx f%d\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), i);
#else
                ".names %x f%d\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), i);
#endif
        } else {
            retval = fprintf(fp,
#if SIZEOF_VOID_P == 8
                ".names %lx %s\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), onames[i]);
#else
                ".names %x %s\n", (ptruint) f[i] / (ptruint) sizeof(DdNode), onames[i]);
#endif
        }
        if (retval == EOF) goto failure;
        if (Cudd_IsComplement(f[i])) {
            retval = fprintf(fp,"%s0 1\n", mv ? ".def 0\n" : "");
        } else {
            retval = fprintf(fp,"%s1 1\n", mv ? ".def 0\n" : "");
        }
        if (retval == EOF) goto failure;
    }

    st__free_table(visited);
    return(1);

failure:
    if (visited != NULL) st__free_table(visited);
    return(0);

}